

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

char read_tag(char *dst,size_t dstlen,int *is_end_tag,char **s,size_t *slen,out_stream_info *stream)

{
  byte bVar1;
  ushort **ppuVar2;
  char **in_RCX;
  undefined4 *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  size_t *in_R8;
  undefined8 in_R9;
  char c;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffcf;
  char prv;
  ulong local_10;
  byte *local_8;
  
  bVar1 = nextout_copy(in_RCX,in_R8,(char)((ulong)in_R9 >> 0x38),
                       (out_stream_info *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT15(in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)))));
  while( true ) {
    uVar4 = false;
    if (bVar1 < 0x80) {
      ppuVar2 = __ctype_b_loc();
      uVar4 = ((*ppuVar2)[(int)(uint)bVar1] & 0x2000) != 0;
    }
    prv = (char)((ulong)in_R9 >> 0x38);
    if ((bool)uVar4 == false) break;
    bVar1 = nextout_copy(in_RCX,in_R8,prv,
                         (out_stream_info *)
                         CONCAT17(bVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffcd,
                                                                CONCAT14(in_stack_ffffffffffffffcc,
                                                                         in_stack_ffffffffffffffc8))
                                                )));
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) {
    *in_RDX = 1;
    bVar1 = nextout_copy(in_RCX,in_R8,prv,
                         (out_stream_info *)
                         CONCAT17(bVar1,(uint7)CONCAT15(in_stack_ffffffffffffffcd,
                                                        CONCAT14(in_stack_ffffffffffffffcc,
                                                                 in_stack_ffffffffffffffc8))));
    while( true ) {
      bVar3 = false;
      if (bVar1 < 0x80) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)(uint)bVar1] & 0x2000) != 0;
      }
      if (bVar3 == false) break;
      bVar1 = nextout_copy(in_RCX,in_R8,(char)((ulong)in_R9 >> 0x38),
                           (out_stream_info *)
                           CONCAT17(bVar1,CONCAT16(uVar4,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8)))));
    }
    in_stack_ffffffffffffffcd = 0;
  }
  else {
    *in_RDX = 0;
  }
  do {
    bVar3 = false;
    if (bVar1 != 0) {
      if (bVar1 < 0x80) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = false;
        if (((*ppuVar2)[(int)(uint)bVar1] & 0x2000) != 0) goto LAB_00150a0a;
      }
      bVar3 = bVar1 != 0x3e;
    }
LAB_00150a0a:
    if (bVar3 == false) {
      if (local_10 != 0) {
        *local_8 = 0;
      }
      return bVar1;
    }
    if (1 < local_10) {
      *local_8 = bVar1;
      local_10 = local_10 - 1;
      local_8 = local_8 + 1;
    }
    bVar1 = nextout_copy(in_RCX,in_R8,(char)((ulong)in_R9 >> 0x38),
                         (out_stream_info *)
                         CONCAT17(bVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffcd,
                                                                CONCAT14(bVar3,
                                                  in_stack_ffffffffffffffc8)))));
  } while( true );
}

Assistant:

static char read_tag(char *dst, size_t dstlen, int *is_end_tag,
                     char **s, size_t *slen, out_stream_info *stream)
{
    char c;
    
    /* skip the opening '<' */
    c = nextout_copy(s, slen, '<', stream);

    /* skip spaces */
    while (outissp(c))
        c = nextout_copy(s, slen, c, stream);

    /* note if this is a closing tag */
    if (c == '/' || c == '\\')
    {
        /* it's an end tag - note it and skip the slash */
        *is_end_tag = TRUE;
        c = nextout_copy(s, slen, c, stream);

        /* skip yet more spaces */
        while (outissp(c))
            c = nextout_copy(s, slen, c, stream);
    }
    else
        *is_end_tag = FALSE;
    
    /* 
     *   find the end of the tag name - the tag continues to the next space,
     *   '>', or end of line 
     */
    for ( ; c != '\0' && !outissp(c) && c != '>' ;
         c = nextout_copy(s, slen, c, stream))
    {
        /* add this to the tag buffer if it fits */
        if (dstlen > 1)
        {
            *dst++ = c;
            --dstlen;
        }
    }
    
    /* null-terminate the tag name */
    if (dstlen > 0)
        *dst = '\0';

    /* return the next character */
    return c;
}